

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.hpp
# Opt level: O1

void __thiscall antlr::InputBuffer::reset(InputBuffer *this)

{
  pointer piVar1;
  
  this->nMarkers = 0;
  this->markerOffset = 0;
  this->numToConsume = 0;
  (this->queue).m_offset = 0;
  piVar1 = (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  return;
}

Assistant:

virtual inline void reset( void )
	{
		nMarkers = 0;
		markerOffset = 0;
		numToConsume = 0;
		queue.clear();
	}